

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O0

Vec3 OpenSteer::RandomVectorInUnitRadiusSphere(void)

{
  Vec3 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3 v;
  Vec3 local_c;
  
  Vec3::Vec3(&local_c);
  do {
    fVar2 = frandom01();
    fVar3 = frandom01();
    fVar4 = frandom01();
    Vec3::set(&local_c,fVar2 + fVar2 + -1.0,fVar3 + fVar3 + -1.0,fVar4 + fVar4 + -1.0);
    fVar2 = Vec3::length((Vec3 *)0x1657ac);
  } while (1.0 <= fVar2);
  VVar1.z = local_c.z;
  VVar1.x = local_c.x;
  VVar1.y = local_c.y;
  return VVar1;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::RandomVectorInUnitRadiusSphere (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               (frandom01()*2) - 1,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}